

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_return_tests.cpp
# Opt level: O3

void __thiscall iu_ReturnTest_x_iutest_x_Test_Test::Body(iu_ReturnTest_x_iutest_x_Test_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  TestFlag *pTVar4;
  Variable *pVVar5;
  int *in_R9;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  allocator<char> local_201;
  AssertionHelper local_200;
  AssertionResult local_1d0;
  undefined1 local_1a8 [16];
  TestPartResultReporterInterface *local_198;
  vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> local_190;
  Type local_178;
  ios_base local_128 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1a8);
  local_1a8._0_8_ = &PTR__Collector_0012e8f8;
  local_178 = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_200);
  ReturnTestCall();
  paVar1 = &local_200.m_part_result.super_iuCodeMessage.m_message.field_2;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
  ;
  local_200.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
  local_200.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
  local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1d0,(SPIFailureChecker *)local_1a8,(string *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT71(local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_allocated_capacity._1_7_,
                             local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[0]) + 1);
  }
  local_1a8._0_8_ = &PTR__Collector_0012e978;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector(&local_190);
  local_1a8._8_8_ = &PTR__ReporterHolder_0012e9a0;
  pVVar5 = iutest::TestEnv::get_vars();
  bVar3 = local_1d0.m_result;
  pVVar5->m_testpartresult_reporter = local_198;
  if (local_1d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,local_1d0.m_message._M_dataplus._M_p,&local_201);
    local_200.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_return_tests.cpp"
    ;
    local_200.m_part_result.super_iuCodeMessage.m_line = 0x30;
    local_200.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_200,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT71(local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity._1_7_,
                               local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  paVar2 = &local_1d0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0.m_message._M_dataplus._M_p,
                    local_1d0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 != false) {
    local_1a8._0_4_ = 0xffffffff;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_1d0,(internal *)"-1","value1",local_1a8,&value1,in_R9);
    if (local_1d0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,local_1d0.m_message._M_dataplus._M_p,&local_201);
      local_200.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_return_tests.cpp"
      ;
      local_200.m_part_result.super_iuCodeMessage.m_line = 0x35;
      local_200.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_200,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        CONCAT71(local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d0.m_message._M_dataplus._M_p,
                      local_1d0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_4_ = 0xffffffff;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_1d0,(internal *)"-1","value2",local_1a8,&value2,in_R9);
    if (local_1d0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,local_1d0.m_message._M_dataplus._M_p,&local_201);
      local_200.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_return_tests.cpp"
      ;
      local_200.m_part_result.super_iuCodeMessage.m_line = 0x36;
      local_200.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_200,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        CONCAT71(local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d0.m_message._M_dataplus._M_p,
                      local_1d0.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(ReturnTest, Test)
{
    IUTEST_ASSERT_FATAL_FAILURE(ReturnTestCall(), "");
#if IUTEST_USE_THROW_ON_ASSERTION_FAILURE
    IUTEST_EXPECT_EQ( 1, value1);
    IUTEST_EXPECT_EQ( 1, value2);
#else
    IUTEST_EXPECT_EQ(-1, value1);
    IUTEST_EXPECT_EQ(-1, value2);
#endif
}